

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  string *__lhs;
  int iVar1;
  TokenType TVar2;
  bool bVar3;
  __type _Var4;
  CppType CVar5;
  LogMessage *other;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar6;
  _func_int **pp_Var7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long i;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  long lVar12;
  float fVar13;
  int64 value;
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int64 int_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EnumDescriptor *local_38;
  
  CVar5 = FieldDescriptor::cpp_type(field);
  if (9 < CVar5 - CPPTYPE_INT32) {
    return true;
  }
  switch(CVar5) {
  case CPPTYPE_INT32:
    bVar3 = ConsumeSignedInteger(this,&value,0x7fffffff);
    if (!bVar3) {
      return false;
    }
    bVar3 = *(int *)(field + 0x4c) == 3;
    uVar9 = value & 0xffffffff;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x208;
    lVar12 = 0xe8;
    break;
  case CPPTYPE_INT64:
    bVar3 = ConsumeSignedInteger(this,&value,0x7fffffffffffffff);
    if (!bVar3) {
      return false;
    }
    iVar1 = *(int *)(field + 0x4c);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x210;
    lVar12 = 0xf0;
    goto LAB_0032ff82;
  case CPPTYPE_UINT32:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffff);
    if (!bVar3) {
      return false;
    }
    bVar3 = *(int *)(field + 0x4c) == 3;
    uVar9 = value & 0xffffffff;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x218;
    lVar12 = 0xf8;
    break;
  case CPPTYPE_UINT64:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffffffffffff);
    if (!bVar3) {
      return false;
    }
    iVar1 = *(int *)(field + 0x4c);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x220;
    lVar12 = 0x100;
LAB_0032ff82:
    if (iVar1 == 3) {
      lVar12 = lVar10;
    }
    (**(code **)((long)pp_Var7 + lVar12))(reflection,message,field,value);
    return true;
  case CPPTYPE_DOUBLE:
    bVar3 = ConsumeDouble(this,(double *)&value);
    if (!bVar3) {
      return false;
    }
    iVar1 = *(int *)(field + 0x4c);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x230;
    lVar12 = 0x110;
    goto LAB_0032ffcc;
  case CPPTYPE_FLOAT:
    bVar3 = ConsumeDouble(this,(double *)&value);
    if (!bVar3) {
      return false;
    }
    iVar1 = *(int *)(field + 0x4c);
    fVar13 = io::SafeDoubleToFloat((double)value);
    value = (int64)(uint)fVar13;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x228;
    lVar12 = 0x108;
LAB_0032ffcc:
    if (iVar1 == 3) {
      lVar12 = lVar10;
    }
    (**(code **)((long)pp_Var7 + lVar12))(value,reflection,message,field);
    return true;
  case CPPTYPE_BOOL:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      local_e8 = (char *)0x0;
      local_e0[0]._M_local_buf[0] = '\0';
      value = (int64)local_e0;
      bVar3 = ConsumeIdentifier(this,(string *)&value);
      if (!bVar3) {
LAB_0033049b:
        std::__cxx11::string::~string((string *)&value);
        return false;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value,"true");
      if (((bVar3) ||
          (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&value,"True"), bVar3)) ||
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value,"t"), bVar3)) {
        if (*(int *)(field + 0x4c) == 3) {
          pp_Var7 = reflection->_vptr_Reflection + 0x47;
        }
        else {
          pp_Var7 = reflection->_vptr_Reflection + 0x23;
        }
        bVar8 = 1;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value,"false");
        if (((!bVar3) &&
            (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&value,"False"), !bVar3)) &&
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&value,"f"), !bVar3)) {
          std::operator+(&local_78,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+(&local_58,&local_78,"\". Value: \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value,&local_58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                        );
          std::operator+(&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value,"\".");
          ReportError(this,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&int_value);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          goto LAB_0033049b;
        }
        if (*(int *)(field + 0x4c) == 3) {
          pp_Var7 = reflection->_vptr_Reflection + 0x47;
        }
        else {
          pp_Var7 = reflection->_vptr_Reflection + 0x23;
        }
        bVar8 = 0;
      }
      (**pp_Var7)(reflection,message,field,(ulong)bVar8);
      goto LAB_003302da;
    }
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,1);
    if (!bVar3) {
      return false;
    }
    uVar9 = (ulong)(value != 0);
    bVar3 = *(int *)(field + 0x4c) == 3;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar10 = 0x238;
    lVar12 = 0x118;
    break;
  case CPPTYPE_ENUM:
    local_e8 = (char *)0x0;
    local_e0[0]._M_local_buf[0] = '\0';
    value = (int64)local_e0;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)&value);
      if (!bVar3) goto LAB_00330384;
      pEVar6 = EnumDescriptor::FindValueByName(this_00,(string *)&value);
LAB_003301b3:
      if (pEVar6 == (EnumValueDescriptor *)0x0) {
        if (this->allow_unknown_enum_ != false) {
          std::operator+(&local_78,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                        );
          std::operator+(&local_58,&local_78,"\" for field \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value,&local_58,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+(&local_b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value,"\".");
          ReportWarning(this,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&int_value);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          bVar3 = true;
          bVar11 = true;
          goto LAB_00330389;
        }
        std::operator+(&local_78,"Unknown enumeration value of \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
        std::operator+(&local_58,&local_78,"\" for field \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value,&local_58,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field)
        ;
        std::operator+(&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value,"\".");
        ReportError(this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&int_value);
        std::__cxx11::string::~string((string *)&local_58);
        this_01 = &local_78;
        goto LAB_0033037f;
      }
      lVar12 = 0x128;
      if (*(int *)(field + 0x4c) == 3) {
        lVar12 = 0x248;
      }
      (**(code **)((long)reflection->_vptr_Reflection + lVar12))(reflection,message,field,pEVar6);
      bVar3 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_b8,"-",(allocator *)&int_value);
      __lhs = &(this->tokenizer_).current_.text;
      _Var4 = std::operator==(__lhs,&local_b8);
      if (_Var4) {
        std::__cxx11::string::~string((string *)&local_b8);
LAB_00330164:
        bVar3 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
        if (bVar3) {
          SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)CONCAT44(int_value._4_4_,(int)int_value),i);
          std::__cxx11::string::operator=((string *)&value,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          pEVar6 = EnumDescriptor::FindValueByNumber(this_00,(int)int_value);
          goto LAB_003301b3;
        }
      }
      else {
        TVar2 = (this->tokenizer_).current_.type;
        local_38 = this_00;
        std::__cxx11::string::~string((string *)&local_b8);
        this_00 = local_38;
        if (TVar2 == TYPE_INTEGER) goto LAB_00330164;
        std::operator+(&local_b8,"Expected integer or identifier, got: ",__lhs);
        ReportError(this,&local_b8);
        this_01 = &local_b8;
LAB_0033037f:
        std::__cxx11::string::~string((string *)this_01);
      }
LAB_00330384:
      bVar3 = true;
    }
    bVar11 = false;
LAB_00330389:
    std::__cxx11::string::~string((string *)&value);
    if (!bVar3) {
      return true;
    }
    return bVar11;
  case CPPTYPE_STRING:
    local_e8 = (char *)0x0;
    local_e0[0]._M_local_buf[0] = '\0';
    value = (int64)local_e0;
    bVar3 = ConsumeString(this,(string *)&value);
    if (!bVar3) goto LAB_0033049b;
    lVar12 = 0x120;
    if (*(int *)(field + 0x4c) == 3) {
      lVar12 = 0x240;
    }
    (**(code **)((long)reflection->_vptr_Reflection + lVar12))(reflection,message,field,&value);
LAB_003302da:
    std::__cxx11::string::~string((string *)&value);
    return true;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              ((LogMessage *)&value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x2f4);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&value);
    return true;
  }
  if (bVar3) {
    lVar12 = lVar10;
  }
  (**(code **)((long)pp_Var7 + lVar12))(reflection,message,field,uVar9);
  return true;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == NULL) {
          if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value  + "\" for "
                        "field \"" + field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value  + "\" for "
                          "field \"" + field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }